

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

AddRegRegCommand * __thiscall
AssemblyCode::AddRegRegCommand::ToString_abi_cxx11_(AddRegRegCommand *this)

{
  CTemp local_c8;
  CTemp local_98;
  string local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  AddRegRegCommand *this_local;
  
  this_local = this;
  IRT::CTemp::ToString_abi_cxx11_(&local_98);
  std::operator+((char *)local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"add ");
  std::operator+(local_58,(char *)local_78);
  IRT::CTemp::ToString_abi_cxx11_(&local_c8);
  std::operator+(local_38,local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return this;
}

Assistant:

std::string AssemblyCode::AddRegRegCommand::ToString( ) const {
    return "add " + leftOperand.ToString( ) + " " + rightOperand.ToString( ) + "\n";
}